

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deFloat16.c
# Opt level: O3

float deFloat16To32(deFloat16 val16)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  float fVar4;
  uint uVar5;
  undefined6 in_register_0000003a;
  ulong uVar6;
  
  uVar6 = CONCAT62(in_register_0000003a,val16);
  uVar2 = (uint)(uVar6 >> 0xf) & 0x1ffff;
  uVar3 = (uint)(uVar6 >> 10) & 0x1f;
  uVar5 = (uint)uVar6 & 0x3ff;
  if (uVar3 == 0x1f) {
    uVar2 = uVar2 << 0x1f;
    if ((val16 & 0x3ff) != 0) {
      uVar2 = uVar2 | (uint)uVar6 << 0xd;
    }
    fVar4 = (float)(uVar2 | 0x7f800000);
  }
  else {
    if ((val16 & 0x7c00) == 0) {
      if ((val16 & 0x3ff) == 0) {
        return (float)(uVar2 << 0x1f);
      }
      uVar1 = 0x1f;
      if ((val16 & 0x3ff) != 0) {
        for (; uVar5 >> uVar1 == 0; uVar1 = uVar1 - 1) {
        }
      }
      uVar3 = (uVar1 ^ 0xffffffe0) + 0x17;
      uVar5 = uVar5 << (~(byte)uVar1 + 0xb & 0x1f) & 0x1fffbfe;
    }
    fVar4 = (float)(uVar3 * 0x800000 + 0x38000000 | uVar2 << 0x1f | uVar5 << 0xd);
  }
  return fVar4;
}

Assistant:

float deFloat16To32 (deFloat16 val16)
{
	deUint32 sign;
	deUint32 expotent;
	deUint32 mantissa;
	union
	{
		float		f;
		deUint32	u;
	} x;

	x.u			= 0u;

	sign		= ((deUint32)val16 >> 15u) & 0x00000001u;
	expotent	= ((deUint32)val16 >> 10u) & 0x0000001fu;
	mantissa	= (deUint32)val16 & 0x000003ffu;

	if (expotent == 0u)
	{
		if (mantissa == 0u)
		{
			/* +/- 0 */
			x.u = sign << 31u;
			return x.f;
		}
		else
		{
			/* Denormalized, normalize it. */

			while (!(mantissa & 0x00000400u))
			{
				mantissa <<= 1u;
				expotent -=  1u;
			}

			expotent += 1u;
			mantissa &= ~0x00000400u;
		}
	}
	else if (expotent == 31u)
	{
		if (mantissa == 0u)
		{
			/* +/- InF */
			x.u = (sign << 31u) | 0x7f800000u;
			return x.f;
		}
		else
		{
			/* +/- NaN */
			x.u = (sign << 31u) | 0x7f800000u | (mantissa << 13u);
			return x.f;
		}
	}

	expotent = expotent + (127u - 15u);
	mantissa = mantissa << 13u;

	x.u = (sign << 31u) | (expotent << 23u) | mantissa;
	return x.f;
}